

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void Assimp::IFC::ConvertColor
               (aiColor4D *out,IfcColourOrFactor *in,ConversionData *conv,aiColor4D *base)

{
  PrimitiveDataType<double> *pPVar1;
  IfcColourRgb *in_00;
  float fVar2;
  char *unaff_retaddr;
  
  pPVar1 = STEP::EXPRESS::DataType::ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>(in);
  if (pPVar1 != (PrimitiveDataType<double> *)0x0) {
    fVar2 = (float)pPVar1->val;
    out->b = fVar2;
    out->g = fVar2;
    out->r = fVar2;
    if (base == (aiColor4D *)0x0) {
      out->a = 1.0;
    }
    else {
      out->r = base->r * fVar2;
      out->g = base->g * fVar2;
      out->b = fVar2 * base->b;
      out->a = base->a;
    }
    return;
  }
  in_00 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcColourRgb>
                    (in,conv->db);
  if (in_00 != (IfcColourRgb *)0x0) {
    ConvertColor(out,in_00);
    return;
  }
  LogFunctions<Assimp::IFCImporter>::LogWarn(unaff_retaddr);
  return;
}

Assistant:

void ConvertColor(aiColor4D& out, const Schema_2x3::IfcColourOrFactor& in,ConversionData& conv,const aiColor4D* base)
{
    if (const ::Assimp::STEP::EXPRESS::REAL* const r = in.ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
        out.r = out.g = out.b = static_cast<float>(*r);
        if(base) {
            out.r *= static_cast<float>( base->r );
            out.g *= static_cast<float>( base->g );
            out.b *= static_cast<float>( base->b );
            out.a = static_cast<float>( base->a );
        }
        else out.a = 1.0;
    }
    else if (const Schema_2x3::IfcColourRgb* const rgb = in.ResolveSelectPtr<Schema_2x3::IfcColourRgb>(conv.db)) {
        ConvertColor(out,*rgb);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcColourOrFactor entity");
    }
}